

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O2

string * __thiscall
CppHttpLibClientConnector::Send
          (string *__return_storage_ptr__,CppHttpLibClientConnector *this,string *request)

{
  JsonRpcException *this_00;
  allocator<char> local_71;
  string local_70;
  Result res;
  
  httplib::Client::Post(&res,&this->httpClient,"/jsonrpc",request,"application/json");
  if (((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
       res.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) &&
     (*(int *)((long)res.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) == 200)
     ) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((long)res.res_._M_t.
                      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                      .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78));
    httplib::Result::~Result(&res);
    return __return_storage_ptr__;
  }
  this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"client connector error, received status != 200",&local_71);
  jsonrpccxx::JsonRpcException::JsonRpcException(this_00,-0x7d03,&local_70);
  __cxa_throw(this_00,&jsonrpccxx::JsonRpcException::typeinfo,
              jsonrpccxx::JsonRpcException::~JsonRpcException);
}

Assistant:

std::string Send(const std::string &request) override {
    auto res = httpClient.Post("/jsonrpc", request, "application/json");
    if (!res || res->status != 200) {
      throw jsonrpccxx::JsonRpcException(-32003, "client connector error, received status != 200");
    }
    return res->body;
  }